

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O3

float Abc_NtkComputeEdgeDept(Abc_Obj_t *pFanout,int iFanin,float Slew)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  uint in_EDX;
  ulong uVar8;
  SC_Timing *pTime;
  SC_Pair LoadIn;
  SC_Pair ArrOut;
  SC_Pair ArrIn;
  SC_Pair local_30;
  SC_Pair local_28;
  SC_Pair local_20;
  SC_Pair local_18;
  SC_Pair local_10;
  
  if (iFanin < 0) {
LAB_003deb0b:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
                  ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
  }
  pVVar5 = (pFanout[5].pNtk)->vPios;
  if ((pVVar5->nSize <= iFanin) || (pVVar6 = (pFanout[5].pNtk)->vBoxes, pVVar6->nSize <= iFanin))
  goto LAB_003deb0b;
  if (*(int *)(*(long *)&pFanout[5].Id + 4) <= iFanin) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar8 = (ulong)(uint)iFanin;
  fVar1 = *(float *)((long)pVVar5->pArray + uVar8 * 4);
  fVar2 = *(float *)((long)pVVar6->pArray + uVar8 * 4);
  uVar3 = *(uint *)(*(long *)(*(long *)&pFanout[5].Id + 8) + uVar8 * 4);
  if ((ulong)uVar3 == 0xffffffff) {
    lVar7 = 0;
  }
  else {
    if (((int)uVar3 < 0) || (pFanout[5].pNext[1].vFanins.nSize <= (int)uVar3)) goto LAB_003deb2a;
    lVar7 = *(long *)(pFanout[5].pNext[1].vFanins.pArray + (ulong)uVar3 * 2);
  }
  local_10.rise = 0.0;
  local_10.fall = 0.0;
  local_18.rise = 0.0;
  local_18.fall = 0.0;
  local_20.rise = 0.0;
  local_20.fall = 0.0;
  local_30.rise = Slew;
  local_30.fall = Slew;
  local_28.rise = fVar1;
  local_28.fall = fVar1;
  if (-1 < (int)in_EDX) {
    uVar3 = *(uint *)(lVar7 + 0x40);
    if ((int)in_EDX < (int)uVar3) {
      if ((int)uVar3 < *(int *)(lVar7 + 0x34)) {
        lVar7 = *(long *)(*(long *)(lVar7 + 0x38) + (ulong)uVar3 * 8);
        if (*(uint *)(lVar7 + 0x44) != uVar3) {
          __assert_fail("Vec_PtrSize(&pPin->vRTimings) == pCell->n_inputs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLib.h"
                        ,0x290,"SC_Timing *Scl_CellPinTime(SC_Cell *, int)");
        }
        lVar7 = *(long *)(*(long *)(lVar7 + 0x48) + (ulong)in_EDX * 8);
        iVar4 = *(int *)(lVar7 + 0xc);
        if (iVar4 == 0) {
          pTime = (SC_Timing *)0x0;
        }
        else {
          if (iVar4 != 1) {
            __assert_fail("Vec_PtrSize(&pRTime->vTimings) == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLib.h"
                          ,0x294,"SC_Timing *Scl_CellPinTime(SC_Cell *, int)");
          }
          pTime = (SC_Timing *)**(undefined8 **)(lVar7 + 0x10);
        }
        Scl_LibPinArrival(pTime,&local_10,&local_30,&local_28,&local_18,&local_20);
        fVar1 = local_18.fall * 0.5 + local_18.rise * 0.5;
        if (0.0 < fVar1) {
          return fVar2 + fVar1;
        }
        __assert_fail("Edge > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclBufSize.c"
                      ,0xaf,"float Abc_NtkComputeEdgeDept(Abc_Obj_t *, int, float)");
      }
LAB_003deb2a:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
  }
  __assert_fail("iPin >= 0 && iPin < pCell->n_inputs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLib.h"
                ,0x28e,"SC_Timing *Scl_CellPinTime(SC_Cell *, int)");
}

Assistant:

static inline float Abc_NtkComputeEdgeDept( Abc_Obj_t * pFanout, int iFanin, float Slew )
{
    float Load = Bus_SclObjLoad( pFanout );
    float Dept = Bus_SclObjDept( pFanout );
    float Edge = Scl_LibPinArrivalEstimate( Abc_SclObjCell(pFanout), iFanin, Slew, Load );
    assert( Edge > 0 );
    return Dept + Edge;
}